

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase1387::run(TestCase1387 *this)

{
  Builder builder_00;
  WirePointer *pWVar1;
  Builder root2;
  Builder root;
  undefined1 in_stack_00000150 [40];
  MallocMessageBuilder builder2;
  MallocMessageBuilder builder;
  PointerBuilder local_398;
  StructBuilder local_378;
  int iStack_350;
  undefined4 uStack_34c;
  StructReader local_348;
  StructBuilder local_310;
  SegmentBuilder *local_2e8;
  CapTableReader *pCStack_2e0;
  Builder local_2d8;
  void *in_stack_fffffffffffffd50;
  WirePointer *in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd60;
  SegmentBuilder *in_stack_fffffffffffffd68;
  CapTableBuilder *in_stack_fffffffffffffd70;
  StructBuilder local_270;
  SegmentReader *local_248;
  CapTableReader *pCStack_240;
  void *local_238;
  WirePointer *pWStack_230;
  StructDataBitCount local_228;
  StructPointerCount SStack_224;
  undefined2 uStack_222;
  int iStack_220;
  undefined4 uStack_21c;
  SegmentReader *local_218;
  CapTableReader *pCStack_210;
  void *local_208;
  WirePointer *pWStack_200;
  StructDataBitCount local_1f8;
  StructPointerCount SStack_1f4;
  undefined2 uStack_1f2;
  int iStack_1f0;
  undefined4 uStack_1ec;
  MallocMessageBuilder local_1e8;
  MallocMessageBuilder local_f8;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_f8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_348,&local_f8.super_MessageBuilder);
  local_1e8.super_MessageBuilder.arenaSpace[1] = local_348.data;
  local_1e8.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)local_348.segment;
  local_1e8.super_MessageBuilder.arenaSpace[0] = local_348.capTable;
  PointerBuilder::getStruct
            (&local_310,(PointerBuilder *)&local_1e8,(StructSize)0x140006,(word *)0x0);
  builder_00._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffd58;
  builder_00._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffd50;
  builder_00._builder.data = (void *)in_stack_fffffffffffffd60;
  builder_00._builder.pointers = (WirePointer *)in_stack_fffffffffffffd68;
  builder_00._builder._32_8_ = in_stack_fffffffffffffd70;
  initTestMessage(builder_00);
  MallocMessageBuilder::MallocMessageBuilder(&local_1e8,0x400,GROW_HEURISTICALLY);
  StructBuilder::asReader(&local_310);
  MessageBuilder::getRootInternal(&local_2d8,&local_1e8.super_MessageBuilder);
  local_348.dataSize = local_378.dataSize;
  local_348.pointerCount = local_378.pointerCount;
  local_348._38_2_ = local_378._38_2_;
  local_348.nestingLimit = iStack_350;
  local_348._44_4_ = uStack_34c;
  local_348.data = local_378.data;
  local_348.pointers = local_378.pointers;
  local_348.segment = &(local_378.segment)->super_SegmentReader;
  local_348.capTable = &(local_378.capTable)->super_CapTableReader;
  local_398.pointer = local_2d8.builder.pointer;
  local_398.segment = local_2d8.builder.segment;
  local_398.capTable = local_2d8.builder.capTable;
  PointerBuilder::setStruct(&local_398,&local_348,false);
  MessageBuilder::getRootInternal((Builder *)&local_378,&local_1e8.super_MessageBuilder);
  local_348.data = local_378.data;
  local_348.segment = &(local_378.segment)->super_SegmentReader;
  local_348.capTable = &(local_378.capTable)->super_CapTableReader;
  PointerBuilder::getStruct
            (&local_270,(PointerBuilder *)&local_348,(StructSize)0x140006,(word *)0x0);
  checkTestMessage((Builder)in_stack_00000150);
  MallocMessageBuilder::~MallocMessageBuilder(&local_1e8);
  MallocMessageBuilder::MallocMessageBuilder(&local_1e8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_398,&local_1e8.super_MessageBuilder);
  local_348.data = local_398.pointer;
  local_348.segment = &(local_398.segment)->super_SegmentReader;
  local_348.capTable = &(local_398.capTable)->super_CapTableReader;
  PointerBuilder::getStruct
            (&local_378,(PointerBuilder *)&local_348,(StructSize)0x140006,(word *)0x0);
  StructBuilder::asReader(&local_310);
  local_348.dataSize = local_1f8;
  local_348.pointerCount = SStack_1f4;
  local_348._38_2_ = uStack_1f2;
  local_348.nestingLimit = iStack_1f0;
  local_348._44_4_ = uStack_1ec;
  local_348.data = local_208;
  local_348.pointers = pWStack_200;
  local_348.segment = local_218;
  local_348.capTable = pCStack_210;
  local_398.pointer = local_378.pointers + 2;
  local_398.segment = local_378.segment;
  local_398.capTable = local_378.capTable;
  PointerBuilder::setStruct(&local_398,&local_348,false);
  local_348.data = local_378.pointers + 2;
  local_348.segment = &(local_378.segment)->super_SegmentReader;
  local_348.capTable = &(local_378.capTable)->super_CapTableReader;
  PointerBuilder::getStruct
            ((StructBuilder *)&stack0xfffffffffffffd68,(PointerBuilder *)&local_348,
             (StructSize)0x140006,(word *)0x0);
  checkTestMessage((Builder)in_stack_00000150);
  MallocMessageBuilder::~MallocMessageBuilder(&local_1e8);
  MallocMessageBuilder::MallocMessageBuilder(&local_1e8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_398,&local_1e8.super_MessageBuilder);
  local_348.data = local_398.pointer;
  local_348.segment = &(local_398.segment)->super_SegmentReader;
  local_348.capTable = &(local_398.capTable)->super_CapTableReader;
  PointerBuilder::getStruct(&local_378,(PointerBuilder *)&local_348,(StructSize)0x10000,(word *)0x0)
  ;
  pWVar1 = local_378.pointers;
  local_2e8 = local_378.segment;
  pCStack_2e0 = &(local_378.capTable)->super_CapTableReader;
  StructBuilder::asReader(&local_310);
  local_348.dataSize = local_228;
  local_348.pointerCount = SStack_224;
  local_348._38_2_ = uStack_222;
  local_348.nestingLimit = iStack_220;
  local_348._44_4_ = uStack_21c;
  local_348.data = local_238;
  local_348.pointers = pWStack_230;
  local_348.segment = local_248;
  local_348.capTable = pCStack_240;
  local_398.segment = local_2e8;
  local_398.capTable = (CapTableBuilder *)pCStack_2e0;
  local_398.pointer = pWVar1;
  PointerBuilder::setStruct(&local_398,&local_348,false);
  local_348.segment = &(local_378.segment)->super_SegmentReader;
  local_348.capTable = &(local_378.capTable)->super_CapTableReader;
  local_348.data = local_378.pointers;
  PointerBuilder::getStruct
            ((StructBuilder *)&stack0xfffffffffffffd40,(PointerBuilder *)&local_348,
             (StructSize)0x140006,(word *)0x0);
  checkTestMessage((Builder)in_stack_00000150);
  MallocMessageBuilder::~MallocMessageBuilder(&local_1e8);
  MallocMessageBuilder::~MallocMessageBuilder(&local_f8);
  return;
}

Assistant:

TEST(Encoding, StructSetters) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<TestAllTypes>();
  initTestMessage(root);

  {
    MallocMessageBuilder builder2;
    builder2.setRoot(root.asReader());
    checkTestMessage(builder2.getRoot<TestAllTypes>());
  }

  {
    MallocMessageBuilder builder2;
    auto root2 = builder2.getRoot<TestAllTypes>();
    root2.setStructField(root);
    checkTestMessage(root2.getStructField());
  }

  {
    MallocMessageBuilder builder2;
    auto root2 = builder2.getRoot<test::TestAnyPointer>();
    root2.getAnyPointerField().setAs<test::TestAllTypes>(root);
    checkTestMessage(root2.getAnyPointerField().getAs<test::TestAllTypes>());
  }
}